

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config(ConfigBase *this,istream *input)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  __type _Var2;
  byte bVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  istream *piVar7;
  undefined1 *puVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  pointer pCVar14;
  reference pvVar15;
  size_type sVar16;
  istream *in_RDX;
  long in_RSI;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_RDI;
  string ename;
  iterator match;
  invalid_argument *ia;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parents;
  string multiline;
  invalid_argument *iarg_1;
  string l2;
  invalid_argument *iarg;
  bool firstLine;
  bool lineExtension;
  value_type keyChar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  citems;
  bool mlquote;
  string item;
  size_type comment_pos;
  size_type delimiter_pos;
  value_type test_char;
  size_t search_start;
  value_type cchar;
  size_t len;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items_buffer;
  string line_sep_chars;
  int currentSectionIndex;
  char aSep;
  char aEnd;
  char aStart;
  bool inMLineValue;
  bool inMLineComment;
  bool inSection;
  bool isINIArray;
  bool isDefaultArray;
  string previousSection;
  string currentSection;
  string buffer;
  string line;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6a0;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *this_00;
  undefined7 in_stack_fffffffffffff6a8;
  undefined1 in_stack_fffffffffffff6af;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_stack_fffffffffffff6b0;
  const_iterator in_stack_fffffffffffff6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c0;
  iterator in_stack_fffffffffffff6c8;
  iterator in_stack_fffffffffffff6d8;
  string *in_stack_fffffffffffff6e0;
  iterator in_stack_fffffffffffff6e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff6f0;
  const_iterator in_stack_fffffffffffff6f8;
  string *in_stack_fffffffffffff748;
  string *in_stack_fffffffffffff750;
  string *in_stack_fffffffffffff758;
  string *local_860;
  char in_stack_fffffffffffff7c7;
  string *in_stack_fffffffffffff7c8;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_stack_fffffffffffff7d0;
  string *in_stack_fffffffffffff7f0;
  string *in_stack_fffffffffffff7f8;
  string *local_800;
  int in_stack_fffffffffffff86c;
  char parentSeparator;
  undefined4 in_stack_fffffffffffff870;
  int in_stack_fffffffffffff874;
  string *in_stack_fffffffffffff878;
  undefined4 in_stack_fffffffffffff8dc;
  char local_70d;
  char local_70c;
  char local_70b;
  bool local_70a;
  bool local_709;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> local_6e0;
  string local_6c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_690;
  ConfigItem *local_680;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> local_678 [3];
  reference local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_620;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_618;
  undefined1 *local_610;
  undefined1 local_5f0 [32];
  string *local_5d0;
  string local_5c8;
  string *local_5a8;
  size_type local_5a0;
  string local_598 [32];
  string local_578 [32];
  string *local_558;
  string local_550 [32];
  string *local_530;
  undefined8 local_528;
  string local_520 [56];
  string local_4e8 [56];
  string local_4b0 [56];
  string local_478 [56];
  string local_440 [32];
  string *local_420;
  string local_418;
  string *local_3f8;
  size_type local_3f0;
  string local_3b8 [32];
  string local_398 [80];
  string local_348 [38];
  byte local_322;
  byte local_321;
  string local_320 [39];
  char local_2f9;
  string local_2f8 [32];
  string local_2d8 [63];
  byte local_299;
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238;
  ulong local_218;
  ulong local_210;
  char local_201;
  ulong local_200;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [59];
  undefined1 local_15d;
  int local_15c;
  ulong local_158;
  string local_150 [32];
  string local_130 [32];
  undefined1 local_110 [29];
  undefined1 local_f3 [3];
  undefined1 *local_f0;
  undefined8 local_e8;
  string local_e0 [32];
  int local_c0;
  char local_ba;
  char local_b9;
  char local_b8;
  byte local_b7;
  byte local_b6;
  byte local_b5;
  bool local_b4;
  bool local_b3;
  byte local_b2;
  allocator local_b1;
  string local_b0 [55];
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  istream *local_18;
  
  local_18 = in_RDX;
  ::std::__cxx11::string::string(local_38);
  ::std::__cxx11::string::string(local_58);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_78,"default",&local_79);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_b0,"default",&local_b1);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_b2 = 0;
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::vector
            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)0x1286b1);
  local_709 = false;
  if ((*(char *)(in_RSI + 0x21) == '[') && (local_709 = false, *(char *)(in_RSI + 0x22) == ']')) {
    local_709 = *(char *)(in_RSI + 0x23) == ',';
  }
  local_b3 = local_709;
  if ((*(char *)(in_RSI + 0x21) == '\0') || (local_70a = false, *(char *)(in_RSI + 0x21) == ' ')) {
    local_70a = *(char *)(in_RSI + 0x21) == *(char *)(in_RSI + 0x22);
  }
  local_b4 = local_70a;
  local_b5 = 0;
  local_b6 = 0;
  local_b7 = 0;
  if (local_70a == false) {
    local_70b = *(char *)(in_RSI + 0x21);
  }
  else {
    local_70b = '[';
  }
  local_b8 = local_70b;
  if (local_70a == false) {
    local_70c = *(char *)(in_RSI + 0x22);
  }
  else {
    local_70c = ']';
  }
  local_b9 = local_70c;
  if ((local_70a == false) || (*(char *)(in_RSI + 0x23) != ' ')) {
    local_70d = *(char *)(in_RSI + 0x23);
  }
  else {
    local_70d = ',';
  }
  local_ba = local_70d;
  local_c0 = 0;
  local_f3[0] = *(char *)(in_RSI + 0x28);
  local_f3[1] = *(char *)(in_RSI + 0x20);
  local_f3[2] = *(char *)(in_RSI + 0x24);
  local_f0 = local_f3;
  local_e8 = 3;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_e0,local_f0,local_e8,local_110 + 0x1c);
  ::std::allocator<char>::~allocator((allocator<char> *)(local_110 + 0x1c));
  do {
    piVar7 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>(local_18,local_58);
    bVar1 = ::std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    parentSeparator = (char)((uint)in_stack_fffffffffffff86c >> 0x18);
    in_stack_fffffffffffff8dc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8dc);
    if (!bVar1) {
      uVar4 = ::std::operator!=(in_stack_fffffffffffff6a0,(char *)in_stack_fffffffffffff698);
      if ((bool)uVar4) {
        ::std::__cxx11::string::string(local_6c8);
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                   in_stack_fffffffffffff6a0);
        detail::generate_parents
                  (in_stack_fffffffffffff878,
                   (string *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                   parentSeparator);
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                   in_stack_fffffffffffff6a0);
        this_00 = &local_6e0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff6b0,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(uVar4,in_stack_fffffffffffff6a8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff6b0);
        pvVar15 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back(this_00);
        ::std::__cxx11::string::operator=((string *)&pvVar15->name,"--");
        while( true ) {
          pvVar15 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back(this_00);
          sVar16 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&pvVar15->parents);
          if (sVar16 < 2) break;
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back(this_00);
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    (in_stack_fffffffffffff6b0,
                     (value_type *)CONCAT17(uVar4,in_stack_fffffffffffff6a8));
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back(this_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x12ad33);
        }
        ::std::__cxx11::string::~string(local_6c8);
      }
      local_b2 = 1;
      local_15c = 1;
      ::std::__cxx11::string::~string(local_e0);
      if ((local_b2 & 1) == 0) {
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
                  (in_stack_fffffffffffff6b0);
      }
      ::std::__cxx11::string::~string(local_b0);
      ::std::__cxx11::string::~string(local_78);
      ::std::__cxx11::string::~string(local_58);
      ::std::__cxx11::string::~string(local_38);
      return in_RDI;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x128920);
    ::std::__cxx11::string::string(local_130);
    detail::trim_copy(in_stack_fffffffffffff6e8._M_current);
    ::std::__cxx11::string::operator=(local_38,local_150);
    ::std::__cxx11::string::~string(local_150);
    local_158 = ::std::__cxx11::string::length();
    if (local_158 < 3) {
      local_15c = 2;
    }
    else {
      iVar5 = ::std::__cxx11::string::compare((ulong)local_38,0,(char *)0x3);
      if ((iVar5 == 0) ||
         (iVar6 = ::std::__cxx11::string::compare((ulong)local_38,0,(char *)0x3), iVar6 == 0)) {
        local_b6 = 1;
        puVar8 = (undefined1 *)::std::__cxx11::string::front();
        local_15d = *puVar8;
        while ((local_b6 & 1) != 0) {
          piVar7 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                             (local_18,local_38);
          bVar1 = ::std::ios::operator_cast_to_bool
                            ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
          if (!bVar1) break;
          detail::trim((string *)0x128b2b);
          bVar1 = detail::hasMLString(in_stack_fffffffffffff6b8._M_current,
                                      (char)((ulong)in_stack_fffffffffffff6b0 >> 0x38));
          if (bVar1) {
            local_b6 = 0;
          }
        }
        local_15c = 2;
      }
      else {
        pcVar9 = (char *)::std::__cxx11::string::front();
        if ((*pcVar9 == '[') && (pcVar9 = (char *)::std::__cxx11::string::back(), *pcVar9 == ']')) {
          bVar1 = ::std::operator!=(in_stack_fffffffffffff6a0,(char *)in_stack_fffffffffffff698);
          if (bVar1) {
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                      ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                       in_stack_fffffffffffff6a0);
            detail::generate_parents
                      (in_stack_fffffffffffff878,
                       (string *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                       (char)((uint)in_stack_fffffffffffff86c >> 0x18));
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                      ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                       in_stack_fffffffffffff6a0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff6b0,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff6b0);
            pvVar15 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                                ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                                 in_stack_fffffffffffff6a0);
            ::std::__cxx11::string::operator=((string *)&pvVar15->name,"--");
          }
          ::std::__cxx11::string::substr((ulong)local_198,(ulong)local_38);
          ::std::__cxx11::string::operator=(local_78,local_198);
          ::std::__cxx11::string::~string(local_198);
          uVar10 = ::std::__cxx11::string::size();
          if (((1 < uVar10) && (pcVar9 = (char *)::std::__cxx11::string::front(), *pcVar9 == '['))
             && (pcVar9 = (char *)::std::__cxx11::string::back(), *pcVar9 == ']')) {
            ::std::__cxx11::string::size();
            ::std::__cxx11::string::substr((ulong)local_1b8,(ulong)local_78);
            ::std::__cxx11::string::operator=(local_78,local_1b8);
            ::std::__cxx11::string::~string(local_1b8);
          }
          ::std::__cxx11::string::string(local_1f8,local_78);
          detail::to_lower((string *)in_stack_fffffffffffff6d8._M_current);
          bVar1 = ::std::operator==(in_stack_fffffffffffff6a0,(char *)in_stack_fffffffffffff698);
          ::std::__cxx11::string::~string(local_1d8);
          ::std::__cxx11::string::~string(local_1f8);
          if (bVar1) {
            ::std::__cxx11::string::operator=(local_78,"default");
          }
          else {
            detail::checkParentSegments
                      (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c7
                      );
          }
          local_b5 = 0;
          _Var2 = ::std::operator==(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8._M_current);
          if (_Var2) {
            local_c0 = local_c0 + 1;
          }
          else {
            local_c0 = 0;
            ::std::__cxx11::string::operator=(local_b0,local_78);
          }
          local_15c = 2;
        }
        else {
          pcVar9 = (char *)::std::__cxx11::string::front();
          if (((*pcVar9 == ';') ||
              (pcVar9 = (char *)::std::__cxx11::string::front(), *pcVar9 == '#')) ||
             (pcVar9 = (char *)::std::__cxx11::string::front(), *pcVar9 == *(char *)(in_RSI + 0x20))
             ) {
            local_15c = 2;
          }
          else {
            local_200 = 0;
            lVar11 = ::std::__cxx11::string::find_first_of((char *)local_38,0x192dff);
            if (lVar11 != -1) {
              while (uVar10 = local_200, uVar12 = ::std::__cxx11::string::size(), uVar10 < uVar12) {
                pcVar9 = (char *)::std::__cxx11::string::operator[]((ulong)local_38);
                local_201 = *pcVar9;
                if (((local_201 == '\"') || (local_201 == '\'')) || (local_201 == '`')) {
                  ::std::__cxx11::string::operator[]((ulong)local_38);
                  sVar13 = detail::close_sequence
                                     (in_stack_fffffffffffff758,(size_t)in_stack_fffffffffffff750,
                                      (char)((ulong)in_stack_fffffffffffff748 >> 0x38));
                  local_200 = sVar13 + 1;
                }
                else {
                  if ((local_201 == *(char *)(in_RSI + 0x24)) ||
                     (local_201 == *(char *)(in_RSI + 0x20))) {
                    local_200 = local_200 - 1;
                    break;
                  }
                  if (((local_201 == ' ') || (local_201 == '\t')) ||
                     (local_201 == *(char *)(in_RSI + 0x28))) {
                    local_200 = local_200 + 1;
                  }
                  else {
                    local_200 = ::std::__cxx11::string::find_first_of(local_38,(ulong)local_e0);
                  }
                }
              }
            }
            local_210 = ::std::__cxx11::string::find_first_of
                                  ((char)local_38,(ulong)(uint)(int)*(char *)(in_RSI + 0x24));
            local_218 = ::std::__cxx11::string::find_first_of
                                  ((char)local_38,(ulong)(uint)(int)*(char *)(in_RSI + 0x20));
            if (local_218 < local_210) {
              local_210 = 0xffffffffffffffff;
            }
            if (local_210 == 0xffffffffffffffff) {
              ::std::__cxx11::string::substr((ulong)local_598,(ulong)local_38);
              detail::trim_copy(in_stack_fffffffffffff6e8._M_current);
              in_stack_fffffffffffff750 = local_578;
              ::std::__cxx11::string::operator=(local_130,in_stack_fffffffffffff750);
              ::std::__cxx11::string::~string(in_stack_fffffffffffff750);
              ::std::__cxx11::string::~string(local_598);
              local_5f0[0x1e] = '\x01';
              in_stack_fffffffffffff758 = &local_5c8;
              local_5d0 = in_stack_fffffffffffff758;
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)in_stack_fffffffffffff758,"true",(allocator *)(local_5f0 + 0x1f))
              ;
              local_5f0[0x1e] = '\0';
              local_5a8 = &local_5c8;
              local_5a0 = 1;
              __l_01._M_len = (size_type)in_stack_fffffffffffff6c0;
              __l_01._M_array = in_stack_fffffffffffff6b8._M_current;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff6b0,__l_01);
              in_stack_fffffffffffff748 = (string *)&local_5a8;
              do {
                in_stack_fffffffffffff748 = in_stack_fffffffffffff748 + -1;
                ::std::__cxx11::string::~string((string *)in_stack_fffffffffffff748);
              } while (in_stack_fffffffffffff748 != &local_5c8);
              ::std::allocator<char>::~allocator((allocator<char> *)(local_5f0 + 0x1f));
            }
            else {
              ::std::__cxx11::string::substr((ulong)local_258,(ulong)local_38);
              detail::trim_copy(in_stack_fffffffffffff6e8._M_current);
              in_stack_fffffffffffff878 = &local_238;
              ::std::__cxx11::string::operator=(local_130,(string *)in_stack_fffffffffffff878);
              ::std::__cxx11::string::~string((string *)in_stack_fffffffffffff878);
              ::std::__cxx11::string::~string(local_258);
              ::std::__cxx11::string::substr((ulong)local_298,(ulong)local_38);
              detail::trim_copy(in_stack_fffffffffffff6e8._M_current);
              ::std::__cxx11::string::~string(local_298);
              in_stack_fffffffffffff874 =
                   ::std::__cxx11::string::compare((ulong)local_278,0,(char *)0x3);
              in_stack_fffffffffffff870 = CONCAT13(1,(int3)in_stack_fffffffffffff870);
              if (in_stack_fffffffffffff874 != 0) {
                in_stack_fffffffffffff86c =
                     ::std::__cxx11::string::compare((ulong)local_278,0,(char *)0x3);
                in_stack_fffffffffffff870 =
                     CONCAT13(in_stack_fffffffffffff86c == 0,(int3)in_stack_fffffffffffff870);
              }
              local_299 = (byte)((uint)in_stack_fffffffffffff870 >> 0x18);
              if ((local_299 == 0) && (local_218 != 0xffffffffffffffff)) {
                ::std::__cxx11::string::string(local_2d8,local_278);
                detail::split_up(in_stack_fffffffffffff7f8,
                                 (char)((ulong)in_stack_fffffffffffff7f0 >> 0x38));
                ::std::__cxx11::string::~string(local_2d8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff6a0);
                detail::trim_copy(in_stack_fffffffffffff6e8._M_current);
                ::std::__cxx11::string::operator=(local_278,local_2f8);
                ::std::__cxx11::string::~string(local_2f8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff6b0);
              }
              if ((local_299 & 1) == 0) {
                uVar10 = ::std::__cxx11::string::size();
                if ((uVar10 < 2) ||
                   (pcVar9 = (char *)::std::__cxx11::string::front(), *pcVar9 != local_b8)) {
                  if ((((local_b3 & 1U) == 0) && ((local_b4 & 1U) == 0)) ||
                     (lVar11 = ::std::__cxx11::string::find_first_of
                                         ((char)local_278,(ulong)(uint)(int)local_ba), lVar11 == -1)
                     ) {
                    if ((((local_b3 & 1U) == 0) && ((local_b4 & 1U) == 0)) ||
                       (lVar11 = ::std::__cxx11::string::find_first_of((char)local_278,0x20),
                       lVar11 == -1)) {
                      local_558 = local_550;
                      ::std::__cxx11::string::string(local_558,local_278);
                      local_530 = local_550;
                      local_528 = 1;
                      __l_00._M_len = (size_type)in_stack_fffffffffffff6c0;
                      __l_00._M_array = in_stack_fffffffffffff6b8._M_current;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffff6b0,__l_00);
                      local_860 = (string *)&local_530;
                      do {
                        local_860 = local_860 + -0x20;
                        ::std::__cxx11::string::~string(local_860);
                      } while (local_860 != local_550);
                    }
                    else {
                      ::std::__cxx11::string::string(local_520,local_278);
                      detail::split_up(in_stack_fffffffffffff7f8,
                                       (char)((ulong)in_stack_fffffffffffff7f0 >> 0x38));
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffff6b0,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff6b0);
                      ::std::__cxx11::string::~string(local_520);
                    }
                  }
                  else {
                    ::std::__cxx11::string::string(local_4e8,local_278);
                    detail::split_up(in_stack_fffffffffffff7f8,
                                     (char)((ulong)in_stack_fffffffffffff7f0 >> 0x38));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff6b0,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6b0);
                    ::std::__cxx11::string::~string(local_4e8);
                  }
                }
                else {
                  ::std::__cxx11::string::string(local_440);
                  while( true ) {
                    pcVar9 = (char *)::std::__cxx11::string::back();
                    in_stack_fffffffffffff7c7 = false;
                    if (*pcVar9 != local_b9) {
                      piVar7 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                         (local_18,local_440);
                      in_stack_fffffffffffff7c7 =
                           ::std::ios::operator_cast_to_bool
                                     ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                    }
                    if ((bool)in_stack_fffffffffffff7c7 == false) break;
                    detail::trim((string *)0x129e19);
                    ::std::__cxx11::string::operator+=(local_278,local_440);
                  }
                  local_15c = 10;
                  ::std::__cxx11::string::~string(local_440);
                  pcVar9 = (char *)::std::__cxx11::string::back();
                  if (*pcVar9 == local_b9) {
                    ::std::__cxx11::string::length();
                    ::std::__cxx11::string::substr((ulong)local_478,(ulong)local_278);
                    detail::split_up(in_stack_fffffffffffff7f8,
                                     (char)((ulong)in_stack_fffffffffffff7f0 >> 0x38));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff6b0,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6b0);
                    ::std::__cxx11::string::~string(local_478);
                  }
                  else {
                    ::std::__cxx11::string::substr((ulong)local_4b0,(ulong)local_278);
                    detail::split_up(in_stack_fffffffffffff7f8,
                                     (char)((ulong)in_stack_fffffffffffff7f0 >> 0x38));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff6b0,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6b0);
                    ::std::__cxx11::string::~string(local_4b0);
                  }
                }
              }
              else {
                pcVar9 = (char *)::std::__cxx11::string::front();
                local_2f9 = *pcVar9;
                ::std::__cxx11::string::substr((ulong)local_320,(ulong)local_58);
                ::std::__cxx11::string::operator=(local_278,local_320);
                ::std::__cxx11::string::~string(local_320);
                detail::ltrim(in_stack_fffffffffffff6e0);
                ::std::__cxx11::string::erase((ulong)local_278,0);
                local_b7 = 1;
                local_321 = 0;
                local_322 = 1;
                uVar10 = ::std::__cxx11::string::empty();
                if (((uVar10 & 1) == 0) &&
                   (pcVar9 = (char *)::std::__cxx11::string::back(), *pcVar9 == '\\')) {
                  ::std::__cxx11::string::pop_back();
                  local_321 = 1;
                }
                else {
                  bVar1 = detail::hasMLString(in_stack_fffffffffffff6b8._M_current,
                                              (char)((ulong)in_stack_fffffffffffff6b0 >> 0x38));
                  if (bVar1) {
                    ::std::__cxx11::string::pop_back();
                    ::std::__cxx11::string::pop_back();
                    ::std::__cxx11::string::pop_back();
                    if (local_2f9 == '\"') {
                      detail::remove_escaped_characters
                                ((string *)CONCAT44(in_stack_fffffffffffff8dc,iVar5));
                      ::std::__cxx11::string::operator=(local_278,local_348);
                      ::std::__cxx11::string::~string(local_348);
                    }
                    local_b7 = 0;
                  }
                }
                do {
                  if ((local_b7 & 1) == 0) break;
                  ::std::__cxx11::string::string(local_398);
                  piVar7 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     (local_18,local_398);
                  bVar3 = ::std::ios::operator!
                                    ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                  if ((bVar3 & 1) == 0) {
                    ::std::__cxx11::string::operator=(local_38,local_398);
                    detail::rtrim(in_stack_fffffffffffff6e0);
                    bVar1 = detail::hasMLString(in_stack_fffffffffffff6b8._M_current,
                                                (char)((ulong)in_stack_fffffffffffff6b0 >> 0x38));
                    if (bVar1) {
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      if ((local_321 & 1) == 0) {
                        if (((local_322 & 1) == 0) ||
                           (uVar10 = ::std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
                          ::std::__cxx11::string::push_back((char)local_278);
                        }
                      }
                      else {
                        detail::ltrim(in_stack_fffffffffffff6e0);
                      }
                      local_322 = 0;
                      ::std::__cxx11::string::operator+=(local_278,local_38);
                      local_b7 = 0;
                      uVar10 = ::std::__cxx11::string::empty();
                      if (((uVar10 & 1) == 0) &&
                         (pcVar9 = (char *)::std::__cxx11::string::back(), *pcVar9 == '\n')) {
                        ::std::__cxx11::string::pop_back();
                      }
                      if (local_2f9 == '\"') {
                        detail::remove_escaped_characters
                                  ((string *)CONCAT44(in_stack_fffffffffffff8dc,iVar5));
                        ::std::__cxx11::string::operator=(local_278,local_3b8);
                        ::std::__cxx11::string::~string(local_3b8);
                      }
                    }
                    else {
                      if ((local_321 & 1) == 0) {
                        if (((local_322 & 1) == 0) ||
                           (uVar10 = ::std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
                          ::std::__cxx11::string::push_back((char)local_278);
                        }
                      }
                      else {
                        detail::trim((string *)0x129aa8);
                      }
                      local_321 = 0;
                      local_322 = 0;
                      uVar10 = ::std::__cxx11::string::empty();
                      if (((uVar10 & 1) == 0) &&
                         (pcVar9 = (char *)::std::__cxx11::string::back(), *pcVar9 == '\\')) {
                        local_321 = 1;
                        ::std::__cxx11::string::pop_back();
                      }
                      ::std::__cxx11::string::operator+=(local_278,local_398);
                    }
                    local_15c = 0;
                  }
                  else {
                    local_15c = 9;
                  }
                  ::std::__cxx11::string::~string(local_398);
                } while (local_15c == 0);
                local_420 = &local_418;
                ::std::__cxx11::string::string((string *)local_420,local_278);
                local_3f8 = &local_418;
                local_3f0 = 1;
                __l._M_len = (size_type)in_stack_fffffffffffff6c0;
                __l._M_array = in_stack_fffffffffffff6b8._M_current;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff6b0,__l);
                in_stack_fffffffffffff7f8 = &local_418;
                local_800 = (string *)&local_3f8;
                do {
                  in_stack_fffffffffffff7f0 = local_800 + -1;
                  ::std::__cxx11::string::~string((string *)in_stack_fffffffffffff7f0);
                  local_800 = in_stack_fffffffffffff7f0;
                } while (in_stack_fffffffffffff7f0 != in_stack_fffffffffffff7f8);
              }
              ::std::__cxx11::string::~string(local_278);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x12a56b);
            detail::generate_parents
                      (in_stack_fffffffffffff878,
                       (string *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                       (char)((uint)in_stack_fffffffffffff86c >> 0x18));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff6b0,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff6b0);
            detail::process_quoted_string
                      (in_stack_fffffffffffff6e8._M_current,
                       (char)((ulong)in_stack_fffffffffffff6e0 >> 0x38),
                       (char)((ulong)in_stack_fffffffffffff6e0 >> 0x30));
            local_610 = local_110;
            local_618._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(in_stack_fffffffffffff698);
            local_620 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff698);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffff6a0,
                                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffff698), bVar1) {
              local_628 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_618);
              detail::process_quoted_string
                        (in_stack_fffffffffffff6e8._M_current,
                         (char)((ulong)in_stack_fffffffffffff6e0 >> 0x38),
                         (char)((ulong)in_stack_fffffffffffff6e0 >> 0x30));
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_618);
            }
            sVar16 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_5f0);
            if (*(byte *)(in_RSI + 0x27) < sVar16) {
              local_15c = 2;
            }
            else {
              uVar10 = ::std::__cxx11::string::empty();
              if (((uVar10 & 1) == 0) && ((local_b5 & 1) == 0)) {
                bVar1 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff6b0);
                if (!bVar1) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff6a0);
                  bVar1 = ::std::operator!=(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
                  if (!bVar1) {
                    if ((-1 < *(short *)(in_RSI + 0x2c)) && (local_c0 != *(short *)(in_RSI + 0x2c)))
                    {
                      local_15c = 2;
                      goto LAB_0012abbc;
                    }
                    in_stack_fffffffffffff6e0 = (string *)local_5f0;
                    local_678[0].
                    super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)in_stack_fffffffffffff698);
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ::__normal_iterator<std::__cxx11::string*>
                              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffff6a0,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffff698);
                    in_stack_fffffffffffff6e8 =
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6b8);
                    local_b5 = 1;
                    local_678[0].
                    super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6e8;
                    goto LAB_0012a8fb;
                  }
                }
                local_15c = 2;
              }
              else {
LAB_0012a8fb:
                in_stack_fffffffffffff6d8 =
                     detail::find_matching_config
                               ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                                in_stack_fffffffffffff6c8._M_current,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8._M_current,
                                SUB81((ulong)in_stack_fffffffffffff6b0 >> 0x38,0));
                local_678[0].super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6d8;
                local_680 = (ConfigItem *)
                            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::end
                                      ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                                       in_stack_fffffffffffff698);
                bVar1 = __gnu_cxx::operator!=
                                  ((__normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                    *)in_stack_fffffffffffff6a0,
                                   (__normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                    *)in_stack_fffffffffffff698);
                if (bVar1) {
                  pCVar14 = __gnu_cxx::
                            __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                            ::operator->((__normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                          *)local_678);
                  sVar16 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size(&pCVar14->inputs);
                  if (((1 < sVar16) &&
                      (sVar16 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_110), 1 < sVar16)) ||
                     ((*(byte *)(in_RSI + 0x2a) & 1) != 0)) {
                    __gnu_cxx::
                    __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                    ::operator->((__normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                  *)local_678);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffff6a0);
                    uVar10 = ::std::__cxx11::string::empty();
                    if ((uVar10 & 1) == 0) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6a0);
                      uVar10 = ::std::__cxx11::string::empty();
                      if ((uVar10 & 1) == 0) {
                        __gnu_cxx::
                        __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                        ::operator->((__normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                      *)local_678);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffff6a0);
                        bVar1 = ::std::operator==(in_stack_fffffffffffff6a0,
                                                  (char *)in_stack_fffffffffffff698);
                        if (!bVar1) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffff6a0);
                          bVar1 = ::std::operator==(in_stack_fffffffffffff6a0,
                                                    (char *)in_stack_fffffffffffff698);
                          if (!bVar1) {
                            __gnu_cxx::
                            __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                            ::operator->((__normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                          *)local_678);
                            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                            ::emplace_back<char_const(&)[3]>
                                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)in_stack_fffffffffffff6b0,
                                       (char (*) [3])
                                       CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8)
                                      );
                            pCVar14 = __gnu_cxx::
                                      __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                      ::operator->((
                                                  __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                                  *)local_678);
                            pCVar14->multiline = true;
                          }
                        }
                      }
                    }
                  }
                  in_stack_fffffffffffff6b0 = local_678;
                  pCVar14 = __gnu_cxx::
                            __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                            ::operator->((__normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                          *)in_stack_fffffffffffff6b0);
                  in_stack_fffffffffffff6c0 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pCVar14->inputs;
                  __gnu_cxx::
                  __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                  ::operator->((__normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                *)in_stack_fffffffffffff6b0);
                  local_690 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)in_stack_fffffffffffff698);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ::__normal_iterator<std::__cxx11::string*>
                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffff6a0,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffff698);
                  in_stack_fffffffffffff6b8._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110;
                  local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)in_stack_fffffffffffff698);
                  local_6a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)in_stack_fffffffffffff698);
                  in_stack_fffffffffffff6c8 =
                       ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                       insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                 ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6f8,
                                  in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8._M_current);
                  local_6a8 = in_stack_fffffffffffff6c8._M_current;
                }
                else {
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                             in_stack_fffffffffffff6a0);
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                             in_stack_fffffffffffff6a0);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6b0,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
                  pvVar15 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                                      ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                                       in_stack_fffffffffffff6a0);
                  ::std::__cxx11::string::operator=((string *)&pvVar15->name,local_130);
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                             in_stack_fffffffffffff6a0);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff6b0,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
                }
                local_15c = 0;
              }
            }
LAB_0012abbc:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff6b0);
          }
        }
      }
    }
    ::std::__cxx11::string::~string(local_130);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff6b0);
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string buffer;
    std::string currentSection = "default";
    std::string previousSection = "default";
    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    bool inSection{false};
    bool inMLineComment{false};
    bool inMLineValue{false};

    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;
    int currentSectionIndex{0};

    std::string line_sep_chars{parentSeparatorChar, commentChar, valueDelimiter};
    while(getline(input, buffer)) {
        std::vector<std::string> items_buffer;
        std::string name;
        line = detail::trim_copy(buffer);
        std::size_t len = line.length();
        // lines have to be at least 3 characters to have any meaning to CLI just skip the rest
        if(len < 3) {
            continue;
        }
        if(line.compare(0, 3, multiline_string_quote) == 0 || line.compare(0, 3, multiline_literal_quote) == 0) {
            inMLineComment = true;
            auto cchar = line.front();
            while(inMLineComment) {
                if(getline(input, line)) {
                    detail::trim(line);
                } else {
                    break;
                }
                if(detail::hasMLString(line, cchar)) {
                    inMLineComment = false;
                }
            }
            continue;
        }
        if(line.front() == '[' && line.back() == ']') {
            if(currentSection != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
                output.back().name = "--";
            }
            currentSection = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(currentSection.size() > 1 && currentSection.front() == '[' && currentSection.back() == ']') {
                currentSection = currentSection.substr(1, currentSection.size() - 2);
            }
            if(detail::to_lower(currentSection) == "default") {
                currentSection = "default";
            } else {
                detail::checkParentSegments(output, currentSection, parentSeparatorChar);
            }
            inSection = false;
            if(currentSection == previousSection) {
                ++currentSectionIndex;
            } else {
                currentSectionIndex = 0;
                previousSection = currentSection;
            }
            continue;
        }

        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }
        std::size_t search_start = 0;
        if(line.find_first_of("\"'`") != std::string::npos) {
            while(search_start < line.size()) {
                auto test_char = line[search_start];
                if(test_char == '\"' || test_char == '\'' || test_char == '`') {
                    search_start = detail::close_sequence(line, search_start, line[search_start]);
                    ++search_start;
                } else if(test_char == valueDelimiter || test_char == commentChar) {
                    --search_start;
                    break;
                } else if(test_char == ' ' || test_char == '\t' || test_char == parentSeparatorChar) {
                    ++search_start;
                } else {
                    search_start = line.find_first_of(line_sep_chars, search_start);
                }
            }
        }
        // Find = in string, split and recombine
        auto delimiter_pos = line.find_first_of(valueDelimiter, search_start + 1);
        auto comment_pos = line.find_first_of(commentChar, search_start);
        if(comment_pos < delimiter_pos) {
            delimiter_pos = std::string::npos;
        }
        if(delimiter_pos != std::string::npos) {

            name = detail::trim_copy(line.substr(0, delimiter_pos));
            std::string item = detail::trim_copy(line.substr(delimiter_pos + 1, std::string::npos));
            bool mlquote =
                (item.compare(0, 3, multiline_literal_quote) == 0 || item.compare(0, 3, multiline_string_quote) == 0);
            if(!mlquote && comment_pos != std::string::npos) {
                auto citems = detail::split_up(item, commentChar);
                item = detail::trim_copy(citems.front());
            }
            if(mlquote) {
                // multiline string
                auto keyChar = item.front();
                item = buffer.substr(delimiter_pos + 1, std::string::npos);
                detail::ltrim(item);
                item.erase(0, 3);
                inMLineValue = true;
                bool lineExtension{false};
                bool firstLine = true;
                if(!item.empty() && item.back() == '\\') {
                    item.pop_back();
                    lineExtension = true;
                } else if(detail::hasMLString(item, keyChar)) {
                    // deal with the first line closing the multiline literal
                    item.pop_back();
                    item.pop_back();
                    item.pop_back();
                    if(keyChar == '\"') {
                        try {
                            item = detail::remove_escaped_characters(item);
                        } catch(const std::invalid_argument &iarg) {
                            throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                        }
                    }
                    inMLineValue = false;
                }
                while(inMLineValue) {
                    std::string l2;
                    if(!std::getline(input, l2)) {
                        break;
                    }
                    line = l2;
                    detail::rtrim(line);
                    if(detail::hasMLString(line, keyChar)) {
                        line.pop_back();
                        line.pop_back();
                        line.pop_back();
                        if(lineExtension) {
                            detail::ltrim(line);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        firstLine = false;
                        item += line;
                        inMLineValue = false;
                        if(!item.empty() && item.back() == '\n') {
                            item.pop_back();
                        }
                        if(keyChar == '\"') {
                            try {
                                item = detail::remove_escaped_characters(item);
                            } catch(const std::invalid_argument &iarg) {
                                throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                            }
                        }
                    } else {
                        if(lineExtension) {
                            detail::trim(l2);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        lineExtension = false;
                        firstLine = false;
                        if(!l2.empty() && l2.back() == '\\') {
                            lineExtension = true;
                            l2.pop_back();
                        }
                        item += l2;
                    }
                }
                items_buffer = {item};
            } else if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                if(item.back() == aEnd) {
                    items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
                } else {
                    items_buffer = detail::split_up(item.substr(1, std::string::npos), aSep);
                }
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item, '\0');
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line.substr(0, comment_pos));
            items_buffer = {"true"};
        }
        std::vector<std::string> parents;
        try {
            parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
            detail::process_quoted_string(name);
            // clean up quotes on the items and check for escaped strings
            for(auto &it : items_buffer) {
                detail::process_quoted_string(it, stringQuote, literalQuote);
            }
        } catch(const std::invalid_argument &ia) {
            throw CLI::ParseError(ia.what(), CLI::ExitCodes::InvalidError);
        }

        if(parents.size() > maximumLayers) {
            continue;
        }
        if(!configSection.empty() && !inSection) {
            if(parents.empty() || parents.front() != configSection) {
                continue;
            }
            if(configIndex >= 0 && currentSectionIndex != configIndex) {
                continue;
            }
            parents.erase(parents.begin());
            inSection = true;
        }
        auto match = detail::find_matching_config(output, parents, name, allowMultipleDuplicateFields);
        if(match != output.end()) {
            if((match->inputs.size() > 1 && items_buffer.size() > 1) || allowMultipleDuplicateFields) {
                // insert a separator if one is not already present
                if(!(match->inputs.back().empty() || items_buffer.front().empty() || match->inputs.back() == "%%" ||
                     items_buffer.front() == "%%")) {
                    match->inputs.emplace_back("%%");
                    match->multiline = true;
                }
            }
            match->inputs.insert(match->inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(currentSection != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(currentSection, ename, parentSeparatorChar);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}